

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManSCHashTablesInit(Fxch_Man_t *pFxchMan)

{
  Vec_Wec_t *p;
  int iVar1;
  Vec_Int_t *p_00;
  Fxch_SCHashTable_t *pFVar2;
  int local_3c;
  int nSubCubes;
  int nLits;
  int nTotalHashed;
  int iCube;
  Vec_Int_t *vCube;
  Vec_Wec_t *vCubes;
  Fxch_Man_t *pFxchMan_local;
  
  p = pFxchMan->vCubes;
  nSubCubes = 0;
  for (nLits = 0; iVar1 = Vec_WecSize(p), nLits < iVar1; nLits = nLits + 1) {
    p_00 = Vec_WecEntry(p,nLits);
    local_3c = Vec_IntSize(p_00);
    iVar1 = local_3c + -1;
    if (2 < iVar1) {
      local_3c = (iVar1 * iVar1 + iVar1) / 2;
    }
    nSubCubes = local_3c + 1 + nSubCubes;
  }
  pFVar2 = Fxch_SCHashTableCreate(pFxchMan,nSubCubes);
  pFxchMan->pSCHashTable = pFVar2;
  return;
}

Assistant:

void Fxch_ManSCHashTablesInit( Fxch_Man_t* pFxchMan )
{
    Vec_Wec_t* vCubes = pFxchMan->vCubes;
    Vec_Int_t* vCube;
    int iCube,
        nTotalHashed = 0;

    Vec_WecForEachLevel( vCubes, vCube, iCube )
    {
        int nLits = Vec_IntSize( vCube ) - 1,
            nSubCubes = nLits <= 2? nLits + 1: ( nLits * nLits + nLits ) / 2;

        nTotalHashed += nSubCubes + 1;
    }

    pFxchMan->pSCHashTable = Fxch_SCHashTableCreate( pFxchMan, nTotalHashed );
}